

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O2

QByteArray * QTimeZonePrivate::aliasToIana(QByteArrayView alias)

{
  bool bVar1;
  AliasData *this;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView local_40;
  QByteArrayView local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this = std::
         __lower_bound<QtTimeZoneCldr::AliasData_const*,QByteArrayView,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(QtTimeZoneCldr::AliasData,QByteArrayView)noexcept>>
                   ((AliasData *)QtTimeZoneCldr::aliasMappingTable,(AliasData *)&DAT_00534148,
                    &local_30,
                    (_Iter_comp_val<bool_(*)(QtTimeZoneCldr::AliasData,_QByteArrayView)_noexcept>)
                    0x3ac1ff);
  if (this != (AliasData *)&DAT_00534148) {
    local_40 = QtTimeZoneCldr::AliasData::aliasId(this);
    bVar1 = ::comparesEqual(&local_40,&local_30);
    if (bVar1) {
      local_40 = QtTimeZoneCldr::AliasData::ianaId(this);
      QByteArrayView::toByteArray(in_RDI,&local_40);
      goto LAB_003ac1dd;
    }
  }
  (in_RDI->d).d = (Data *)0x0;
  (in_RDI->d).ptr = (char *)0x0;
  (in_RDI->d).size = 0;
LAB_003ac1dd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QTimeZonePrivate::aliasToIana(QByteArrayView alias)
{
    const auto data = std::lower_bound(std::begin(aliasMappingTable), std::end(aliasMappingTable),
                                       alias, earlierAliasId);
    if (data != std::end(aliasMappingTable) && data->aliasId() == alias)
        return data->ianaId().toByteArray();
    // Note: empty return means not an alias, which is true of an ID that others
    // are aliases to, as the table omits self-alias entries. Let caller sort
    // that out, rather than allocating to return alias.toByteArray().
    return {};
}